

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitDecPOMDPDiscrete.cpp
# Opt level: O2

void PlanningUnitDecPOMDPDiscrete::ExportDecPOMDPFile
               (string *filename,DecPOMDPDiscreteInterface *decpomdp)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  E *this_00;
  uint uVar9;
  Index i;
  uint uVar10;
  Index s0;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  uint uVar14;
  double dVar15;
  Index a_1;
  Index a_3;
  Index a_2;
  string local_3d8;
  ofstream fp;
  byte abStack_398 [480];
  stringstream ss;
  ostream local_1a8 [376];
  
  uVar2 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0x40)) + 0x10
                      ))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0x40));
  uVar3 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) + 0x30
                      ))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
  std::ofstream::ofstream(&fp,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_398[*(long *)(_fp + -0x18)] & 5) != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar4 = std::operator<<(local_1a8,
                             "PlanningUnitDecPOMDPDiscrete::ExportDecPOMDPFile: failed to open file "
                            );
    std::operator<<(poVar4,(string *)filename);
    this_00 = (E *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    E::E(this_00,&local_3d8);
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  poVar4 = std::operator<<((ostream *)&fp,"agents: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&fp,"discount: ");
  dVar15 = (double)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                         *(long *)(*(long *)decpomdp + -0xb0)) + 0x70))
                             (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb0));
  poVar4 = std::ostream::_M_insert<double>(dVar15);
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar1 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb0)) + 0x80
                      ))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb0));
  if (iVar1 == 0) {
    pcVar13 = "values: reward";
  }
  else {
    if (iVar1 != 1) goto LAB_0046e301;
    pcVar13 = "values: cost";
  }
  poVar4 = std::operator<<((ostream *)&fp,pcVar13);
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_0046e301:
  std::operator<<((ostream *)&fp,"states:");
  for (uVar7 = 0; uVar7 < uVar3; uVar7 = (ulong)((int)uVar7 + 1)) {
    poVar4 = std::operator<<((ostream *)&fp," ");
    plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                           *(long *)(*(long *)decpomdp + -0xb8)) + 0x38))
                               (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),uVar7);
    (**(code **)(*plVar5 + 0x18))((string *)&ss,plVar5);
    std::operator<<(poVar4,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&fp);
  plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                         *(long *)(*(long *)decpomdp + -0xb8)) + 0x50))
                             (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
  poVar4 = std::operator<<((ostream *)&fp,"start:");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (uVar7 = 0; uVar7 < uVar3; uVar7 = (ulong)((int)uVar7 + 1)) {
    if ((int)uVar7 != 0) {
      std::operator<<((ostream *)&fp," ");
    }
    dVar15 = (double)(**(code **)(*plVar5 + 0x10))(plVar5,uVar7);
    std::ostream::_M_insert<double>(dVar15);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&fp);
  poVar4 = std::operator<<((ostream *)&fp,"actions:");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (uVar7 = 0; uVar2 != uVar7; uVar7 = (ulong)((int)uVar7 + 1)) {
    uVar11 = 0;
    while( true ) {
      uVar6 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) +
                          0x60))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),uVar7);
      if (uVar6 <= uVar11) break;
      if ((int)uVar11 != 0) {
        std::operator<<((ostream *)&fp," ");
      }
      plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                             *(long *)(*(long *)decpomdp + -0xb8)) + 0x78))
                                 (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),uVar7,
                                  uVar11);
      (**(code **)(*plVar5 + 0x18))((string *)&ss,plVar5);
      std::operator<<((ostream *)&fp,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      uVar11 = (ulong)((int)uVar11 + 1);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&fp);
  }
  poVar4 = std::operator<<((ostream *)&fp,"observations:");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (uVar7 = 0; uVar2 != uVar7; uVar7 = (ulong)((int)uVar7 + 1)) {
    uVar11 = 0;
    while( true ) {
      uVar6 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) +
                          0xc0))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
      if (uVar6 <= uVar11) break;
      if ((int)uVar11 != 0) {
        std::operator<<((ostream *)&fp," ");
      }
      plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                             *(long *)(*(long *)decpomdp + -0xb8)) + 0xd0))
                                 (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),uVar7,
                                  uVar11);
      (**(code **)(*plVar5 + 0x18))((string *)&ss,plVar5);
      std::operator<<((ostream *)&fp,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      uVar11 = (ulong)((int)uVar11 + 1);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&fp);
  }
  uVar9 = 0;
  while( true ) {
    uVar7 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) +
                        0x68))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
    if (uVar7 <= uVar9) break;
    for (uVar12 = 0; uVar12 < uVar3; uVar12 = uVar12 + 1) {
      for (uVar10 = 0; uVar10 < uVar3; uVar10 = uVar10 + 1) {
        dVar15 = (double)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                               *(long *)(*(long *)decpomdp + -0xb8)) + 0x108))
                                   (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),
                                    (ulong)uVar12,uVar9,(ulong)uVar10);
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   (**(code **)(*(long *)(&decpomdp->field_0x0 +
                                         *(long *)(*(long *)decpomdp + -0xb8)) + 0x98))
                             (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),uVar9);
          std::operator<<((ostream *)&fp,"T:");
          for (uVar14 = 0; uVar2 != uVar14; uVar14 = uVar14 + 1) {
            poVar4 = std::operator<<((ostream *)&fp," ");
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(pvVar8,(ulong)uVar14);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          }
          poVar4 = std::operator<<((ostream *)&fp," : ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4," : ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::operator<<(poVar4," : ");
          poVar4 = std::ostream::_M_insert<double>(dVar15);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
      }
    }
    uVar9 = uVar9 + 1;
  }
  _a_2 = 0;
  while( true ) {
    uVar7 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) +
                        0x68))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
    if (uVar7 <= _a_2) break;
    _a_1 = 0;
    while( true ) {
      uVar7 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) +
                          200))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
      if (uVar7 <= _a_1) break;
      for (uVar9 = 0; uVar9 < uVar3; uVar9 = uVar9 + 1) {
        dVar15 = (double)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                               *(long *)(*(long *)decpomdp + -0xb8)) + 0x118))
                                   (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),_a_2
                                    ,(ulong)uVar9,_a_1);
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   (**(code **)(*(long *)(&decpomdp->field_0x0 +
                                         *(long *)(*(long *)decpomdp + -0xb8)) + 0x98))
                             (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),_a_2);
          this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8))
                             + 0xe8))
                           (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),_a_1);
          std::operator<<((ostream *)&fp,"O:");
          for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
            poVar4 = std::operator<<((ostream *)&fp," ");
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(pvVar8,(ulong)uVar12);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          }
          poVar4 = std::operator<<((ostream *)&fp," : ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::operator<<(poVar4," :");
          for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
            poVar4 = std::operator<<((ostream *)&fp," ");
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this,(ulong)uVar12);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          }
          std::operator<<((ostream *)&fp," : ");
          poVar4 = std::ostream::_M_insert<double>(dVar15);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
      }
      _a_1 = (ulong)(a_1 + 1);
    }
    _a_2 = (ulong)(a_2 + 1);
  }
  _a_3 = 0;
  while( true ) {
    uVar7 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) +
                        0x68))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
    if (uVar7 <= _a_3) break;
    for (uVar9 = 0; uVar9 < uVar3; uVar9 = uVar9 + 1) {
      dVar15 = (double)(**(code **)(*(long *)decpomdp + 0xc0))(decpomdp,uVar9,_a_3);
      if ((dVar15 != 0.0) || (NAN(dVar15))) {
        pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8))
                             + 0x98))
                           (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),_a_3);
        std::operator<<((ostream *)&fp,"R:");
        for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
          poVar4 = std::operator<<((ostream *)&fp," ");
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(pvVar8,(ulong)uVar12);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        }
        poVar4 = std::operator<<((ostream *)&fp," : ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4," : * : * : ");
        poVar4 = std::ostream::_M_insert<double>(dVar15);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    _a_3 = (ulong)(a_3 + 1);
  }
  std::ofstream::~ofstream(&fp);
  return;
}

Assistant:

void PlanningUnitDecPOMDPDiscrete::ExportDecPOMDPFile(
    const string & filename,
    const DecPOMDPDiscreteInterface *decpomdp)
{
    size_t nrAg=decpomdp->GetNrAgents(),
        nrS=decpomdp->GetNrStates();
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "PlanningUnitDecPOMDPDiscrete::ExportDecPOMDPFile: failed to open file "
           << filename;
        throw(E(ss.str()));
    }

    fp << "agents: " << nrAg << endl;
    fp << "discount: " << decpomdp->GetDiscount() << endl;
    switch(decpomdp->GetRewardType())
    {
    case REWARD:
        fp << "values: reward" << endl;
        break;
    case COST:
        fp << "values: cost" << endl;
    }

    fp << "states:";
    for(Index s=0;s<nrS;s++)
        fp << " "  << decpomdp->GetState(s)->SoftPrintBrief();
    fp << endl;

    StateDistribution* isd = decpomdp->GetISD();
    fp << "start:" << endl;
    for(Index s0=0;s0<nrS;s0++)
    {
        if(s0>0)
            fp << " ";
        double bs = isd->GetProbability(s0);
        fp <<  bs;
    }
    fp << endl;

    fp << "actions:" << endl;
    for(Index i=0;i!=nrAg;++i)
    {
        for(Index a=0;a<decpomdp->GetNrActions(i);a++)
        {
            if(a>0)
                fp << " ";
            fp << decpomdp->GetAction(i,a)->SoftPrintBrief();
        }
        fp << endl;
    }

    fp << "observations:" << endl;
    for(Index i=0;i!=nrAg;++i)
    {
        for(Index o=0;o<decpomdp->GetNrObservations(i);o++)
        {
            if(o>0)
                fp << " ";
            fp << decpomdp->GetObservation(i,o)->SoftPrintBrief();
        }
        fp << endl;
    }

    double p;
    for(Index a=0;a<decpomdp->GetNrJointActions();a++)
        for(Index s0=0;s0<nrS;s0++)
            for(Index s1=0;s1<nrS;s1++)
            {
                p=decpomdp->GetTransitionProbability(s0,a,s1);
                if(p!=0)
                {
                    const vector<Index> &aIs=decpomdp->JointToIndividualActionIndices(a);
                    fp << "T:";
                    for(Index i=0;i!=nrAg;++i)
                        fp << " " << aIs.at(i);
                    fp << " : " << s0 << " : " << s1 << " : " 
                       << p << endl;
                }
            }

    for(Index a=0;a<decpomdp->GetNrJointActions();a++)
        for(Index o=0;o<decpomdp->GetNrJointObservations();o++)
            for(Index s1=0;s1<nrS;s1++)
            {
                p=decpomdp->GetObservationProbability(a,s1,o);
                if(p!=0)
                {
                    const vector<Index> &aIs=decpomdp->JointToIndividualActionIndices(a);
                    const vector<Index> &oIs=decpomdp->JointToIndividualObservationIndices(o);
                    fp << "O:";

                    for(Index i=0;i!=nrAg;++i)
                        fp << " " << aIs.at(i);

                    fp << " : " << s1 << " :";

                    for(Index i=0;i!=nrAg;++i)
                        fp << " " << oIs.at(i);
                    fp << " : " << p << endl;
                }
            }

    for(Index a=0;a<decpomdp->GetNrJointActions();a++)
        for(Index s0=0;s0<nrS;s0++)
        {
            p=decpomdp->GetReward(s0,a);
            if(p!=0)
            {
                const vector<Index> &aIs=decpomdp->JointToIndividualActionIndices(a);
                fp << "R:";

                for(Index i=0;i!=nrAg;++i)
                    fp << " " << aIs.at(i);
                fp << " : " << s0 << " : * : * : " << p << endl;
            }
        }
}